

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_row_mt_mem_dealloc(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_row;
  int tile_col;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  AV1EncRowMultiThreadSync *in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  
  iVar1 = *(int *)(in_RDI + 0x9ae9c);
  iVar2 = *(int *)(in_RDI + 0x9ae98);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 =
           (AV1EncRowMultiThreadSync *)
           (*(long *)(in_RDI + 0x71318) + (long)(local_20 * iVar1 + local_1c) * 0x5d10);
      av1_row_mt_sync_mem_dealloc(in_stack_ffffffffffffffd0);
      if (*(char *)(in_RDI + 0x42360) != '\0') {
        aom_free(in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffffd0[0x1bb].num_finished_cols = (int *)0x0;
      }
    }
  }
  aom_free(in_stack_ffffffffffffffd0);
  *(undefined8 *)(in_RDI + 0x9afa8) = 0;
  *(undefined4 *)(in_RDI + 0x9aea0) = 0;
  *(undefined4 *)(in_RDI + 0x9aea4) = 0;
  *(undefined4 *)(in_RDI + 0x9afb0) = 0;
  return;
}

Assistant:

void av1_row_mt_mem_dealloc(AV1_COMP *cpi) {
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = enc_row_mt->allocated_tile_cols;
  const int tile_rows = enc_row_mt->allocated_tile_rows;
  int tile_col, tile_row;

  // Free row based multi-threading sync memory
  for (tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];

      av1_row_mt_sync_mem_dealloc(&this_tile->row_mt_sync);

      if (cpi->oxcf.algo_cfg.cdf_update_mode) {
        aom_free(this_tile->row_ctx);
        this_tile->row_ctx = NULL;
      }
    }
  }
  aom_free(enc_row_mt->num_tile_cols_done);
  enc_row_mt->num_tile_cols_done = NULL;
  enc_row_mt->allocated_rows = 0;
  enc_row_mt->allocated_cols = 0;
  enc_row_mt->allocated_sb_rows = 0;
}